

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O0

int sqlite3_internal_bind_value(sqlite3_stmt *stmt,int idx,Value *value)

{
  bool bVar1;
  size_type sVar2;
  Value *in_RDX;
  int in_ESI;
  long in_RDI;
  size_type in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int local_4;
  
  if (((in_RDI == 0) ||
      (bVar1 = std::
               unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
               ::operator_bool((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
                                *)0x29ffd4d), !bVar1)) ||
     (bVar1 = std::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>::
              operator_bool((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>
                             *)0x29ffd61), bVar1)) {
    local_4 = 0x15;
  }
  else {
    if (0 < in_ESI) {
      duckdb::
      unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>::
      operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                  *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0));
      sVar2 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *)0x29ffd9d);
      if (in_ESI <= (int)sVar2) {
        duckdb::vector<duckdb::Value,_true>::operator[]
                  ((vector<duckdb::Value,_true> *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8);
        duckdb::Value::operator=(in_RDX,(Value *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0));
        return 0;
      }
    }
    local_4 = 0x19;
  }
  return local_4;
}

Assistant:

int sqlite3_internal_bind_value(sqlite3_stmt *stmt, int idx, Value value) {
	if (!stmt || !stmt->prepared || stmt->result) {
		return SQLITE_MISUSE;
	}
	if (idx < 1 || idx > (int)stmt->prepared->named_param_map.size()) {
		return SQLITE_RANGE;
	}
	stmt->bound_values[idx - 1] = value;
	return SQLITE_OK;
}